

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

base_uint<128UL,_void> __thiscall
jbcoin::STObject::getFieldByValue<jbcoin::STBitString<128ul>,jbcoin::base_uint<128ul,void>>
          (STObject *this,SField *field)

{
  int iVar1;
  STBase *pSVar2;
  value_type *pvVar3;
  base_uint<128UL,_void> bVar4;
  STBitString<128UL> *local_50;
  STBitString<128UL> *cf;
  SerializedTypeID id;
  STBase *rf;
  SField *field_local;
  STObject *this_local;
  uint32_t local_10 [2];
  undefined1 auVar5 [12];
  
  pSVar2 = peekAtPField(this,field);
  if (pSVar2 == (STBase *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*pSVar2->_vptr_STBase[4])();
  if (iVar1 == 0) {
    base_uint<128UL,_void>::base_uint((base_uint<128UL,_void> *)&this_local);
  }
  else {
    if (pSVar2 == (STBase *)0x0) {
      local_50 = (STBitString<128UL> *)0x0;
    }
    else {
      local_50 = (STBitString<128UL> *)
                 __dynamic_cast(pSVar2,&STBase::typeinfo,&STBitString<128ul>::typeinfo,0);
    }
    if (local_50 == (STBitString<128UL> *)0x0) {
      Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
    }
    pvVar3 = STBitString<128UL>::value(local_50);
    this_local = *(STObject **)pvVar3->pn;
    local_10 = *(uint32_t (*) [2])(pvVar3->pn + 2);
  }
  bVar4.pn[0] = (uint32_t)this_local;
  auVar5._4_4_ = (uint32_t)((ulong)this_local >> 0x20);
  bVar4.pn[2] = local_10[0];
  bVar4.pn[3] = local_10[1];
  return (base_uint<128UL,_void>)bVar4.pn;
}

Assistant:

V getFieldByValue (SField const& field) const
    {
        const STBase* rf = peekAtPField (field);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        SerializedTypeID id = rf->getSType ();

        if (id == STI_NOTPRESENT)
            return V (); // optional field not present

        const T* cf = dynamic_cast<const T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        return cf->value ();
    }